

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_2_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined1 (*pauVar1) [16];
  short *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [14];
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  short sVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  short sVar38;
  short sVar40;
  short sVar42;
  short sVar44;
  short sVar46;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar36;
  short sVar48;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar66 [16];
  short sVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar87;
  ulong uVar89;
  ulong uVar90;
  short sVar92;
  short sVar94;
  short sVar96;
  short sVar98;
  short sVar100;
  short sVar102;
  undefined1 auVar91 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  short local_98;
  short sStack_96;
  undefined1 local_88 [16];
  ulong local_68;
  short local_48;
  short sStack_46;
  ushort uVar21;
  ushort uVar35;
  ushort uVar37;
  ushort uVar39;
  ushort uVar41;
  ushort uVar43;
  ushort uVar45;
  ushort uVar47;
  ushort uVar88;
  ushort uVar93;
  ushort uVar95;
  ushort uVar97;
  ushort uVar99;
  ushort uVar101;
  ushort uVar103;
  ushort uVar104;
  
  lVar20 = (long)dir;
  lVar14 = (long)cdef_directions_padded[lVar20 + 4][0];
  lVar15 = (long)cdef_directions_padded[lVar20 + 4][1];
  lVar18 = (long)cdef_directions_padded[lVar20][0];
  lVar20 = (long)cdef_directions_padded[lVar20][1];
  if (block_width == 8) {
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar16 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar16 = 0;
      }
    }
    auVar25 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    uVar23 = auVar25._0_4_;
    auVar25 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar26 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    uVar24 = auVar26._0_4_;
    local_68 = (ulong)uVar16;
    for (lVar19 = 0; lVar19 < block_height; lVar19 = lVar19 + 2) {
      auVar121 = *(undefined1 (*) [16])in;
      pauVar1 = (undefined1 (*) [16])((long)in + 0x120);
      sVar50 = *(short *)*pauVar1;
      sVar52 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 2);
      sVar54 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 4);
      sVar56 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 6);
      sVar58 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 8);
      sVar60 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 10);
      sVar62 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xc);
      auVar13 = *(undefined1 (*) [14])*pauVar1;
      sVar64 = *(short *)(*(undefined1 (*) [16])((long)in + 0x120) + 0xe);
      auVar153 = lddqu(in_XMM12,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar14 * 2));
      auVar137 = lddqu(in_XMM11,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar14 * 2));
      auVar167 = lddqu(in_XMM13,*(undefined1 (*) [16])((long)in + lVar14 * -2));
      auVar79 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar14 * -2 + 0x120));
      auVar115 = lddqu(in_XMM8,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar18 * 2));
      auVar107 = lddqu(in_XMM7,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar18 * 2));
      auVar131 = lddqu(in_XMM10,*(undefined1 (*) [16])((long)in + lVar18 * -2));
      auVar105 = lddqu(in_XMM6,*(undefined1 (*) [16])((long)in + lVar18 * -2 + 0x120));
      sVar49 = auVar121._0_2_;
      auVar154._0_2_ = auVar153._0_2_ - sVar49;
      sVar51 = auVar121._2_2_;
      auVar154._2_2_ = auVar153._2_2_ - sVar51;
      sVar53 = auVar121._4_2_;
      auVar154._4_2_ = auVar153._4_2_ - sVar53;
      sVar55 = auVar121._6_2_;
      auVar154._6_2_ = auVar153._6_2_ - sVar55;
      sVar57 = auVar121._8_2_;
      auVar154._8_2_ = auVar153._8_2_ - sVar57;
      sVar59 = auVar121._10_2_;
      auVar154._10_2_ = auVar153._10_2_ - sVar59;
      sVar61 = auVar121._12_2_;
      auVar154._12_2_ = auVar153._12_2_ - sVar61;
      sVar63 = auVar121._14_2_;
      auVar154._14_2_ = auVar153._14_2_ - sVar63;
      auVar138._0_2_ = auVar137._0_2_ - sVar50;
      auVar138._2_2_ = auVar137._2_2_ - sVar52;
      auVar138._4_2_ = auVar137._4_2_ - sVar54;
      auVar138._6_2_ = auVar137._6_2_ - sVar56;
      auVar138._8_2_ = auVar137._8_2_ - sVar58;
      auVar138._10_2_ = auVar137._10_2_ - sVar60;
      auVar138._12_2_ = auVar137._12_2_ - sVar62;
      auVar138._14_2_ = auVar137._14_2_ - sVar64;
      auVar176 = pabsw(in_XMM14,auVar154);
      auVar155 = psraw(auVar154,0xf);
      uVar21 = auVar176._0_2_;
      auVar27._0_2_ = uVar21 >> local_68;
      uVar35 = auVar176._2_2_;
      auVar27._2_2_ = uVar35 >> local_68;
      uVar37 = auVar176._4_2_;
      auVar27._4_2_ = uVar37 >> local_68;
      uVar39 = auVar176._6_2_;
      auVar27._6_2_ = uVar39 >> local_68;
      uVar41 = auVar176._8_2_;
      auVar27._8_2_ = uVar41 >> local_68;
      uVar43 = auVar176._10_2_;
      auVar27._10_2_ = uVar43 >> local_68;
      uVar45 = auVar176._12_2_;
      uVar47 = auVar176._14_2_;
      auVar27._12_2_ = uVar45 >> local_68;
      auVar27._14_2_ = uVar47 >> local_68;
      auVar153 = pabsw(auVar121,auVar138);
      uVar88 = auVar153._0_2_;
      auVar185._0_2_ = uVar88 >> local_68;
      uVar93 = auVar153._2_2_;
      auVar185._2_2_ = uVar93 >> local_68;
      uVar95 = auVar153._4_2_;
      auVar185._4_2_ = uVar95 >> local_68;
      uVar97 = auVar153._6_2_;
      auVar185._6_2_ = uVar97 >> local_68;
      uVar99 = auVar153._8_2_;
      auVar185._8_2_ = uVar99 >> local_68;
      uVar101 = auVar153._10_2_;
      auVar185._10_2_ = uVar101 >> local_68;
      uVar103 = auVar153._12_2_;
      uVar104 = auVar153._14_2_;
      auVar185._12_2_ = uVar103 >> local_68;
      auVar185._14_2_ = uVar104 >> local_68;
      auVar139 = psraw(auVar138,0xf);
      auVar121._4_4_ = uVar23;
      auVar121._0_4_ = uVar23;
      auVar121._8_4_ = uVar23;
      auVar121._12_4_ = uVar23;
      auVar66 = psubusw(auVar121,auVar27);
      auVar137 = psubusw(auVar121,auVar185);
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      sVar22 = auVar137._0_2_;
      sVar36 = auVar137._2_2_;
      sVar38 = auVar137._4_2_;
      sVar40 = auVar137._6_2_;
      sVar42 = auVar137._8_2_;
      sVar44 = auVar137._10_2_;
      sVar46 = auVar137._12_2_;
      sVar48 = auVar137._14_2_;
      auVar67._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar155._0_2_;
      auVar67._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar155._2_2_;
      auVar67._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar155._4_2_;
      auVar67._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar155._6_2_;
      auVar67._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar155._8_2_;
      auVar67._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar155._10_2_;
      auVar67._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar155._12_2_;
      auVar67._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar155._14_2_;
      auVar28._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar139._0_2_;
      auVar28._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar139._2_2_;
      auVar28._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar139._4_2_;
      auVar28._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar139._6_2_;
      auVar28._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar139._8_2_;
      auVar28._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar139._10_2_;
      auVar28._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar139._12_2_;
      auVar28._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar139._14_2_;
      auVar67 = auVar67 ^ auVar155;
      auVar28 = auVar28 ^ auVar139;
      auVar168._0_2_ = auVar167._0_2_ - sVar49;
      auVar168._2_2_ = auVar167._2_2_ - sVar51;
      auVar168._4_2_ = auVar167._4_2_ - sVar53;
      auVar168._6_2_ = auVar167._6_2_ - sVar55;
      auVar168._8_2_ = auVar167._8_2_ - sVar57;
      auVar168._10_2_ = auVar167._10_2_ - sVar59;
      auVar168._12_2_ = auVar167._12_2_ - sVar61;
      auVar168._14_2_ = auVar167._14_2_ - sVar63;
      sVar87 = auVar13._0_2_;
      auVar80._0_2_ = auVar79._0_2_ - sVar87;
      sVar92 = auVar13._2_2_;
      auVar80._2_2_ = auVar79._2_2_ - sVar92;
      sVar94 = auVar13._4_2_;
      auVar80._4_2_ = auVar79._4_2_ - sVar94;
      sVar96 = auVar13._6_2_;
      auVar80._6_2_ = auVar79._6_2_ - sVar96;
      sVar98 = auVar13._8_2_;
      auVar80._8_2_ = auVar79._8_2_ - sVar98;
      sVar100 = auVar13._10_2_;
      auVar80._10_2_ = auVar79._10_2_ - sVar100;
      sVar102 = auVar13._12_2_;
      auVar80._12_2_ = auVar79._12_2_ - sVar102;
      auVar80._14_2_ = auVar79._14_2_ - sVar64;
      auVar137 = pabsw(auVar153,auVar168);
      auVar139 = psraw(auVar168,0xf);
      auVar153 = pabsw(auVar176,auVar80);
      auVar66 = psraw(auVar80,0xf);
      uVar21 = auVar137._0_2_;
      auVar140._0_2_ = uVar21 >> local_68;
      uVar35 = auVar137._2_2_;
      auVar140._2_2_ = uVar35 >> local_68;
      uVar37 = auVar137._4_2_;
      auVar140._4_2_ = uVar37 >> local_68;
      uVar39 = auVar137._6_2_;
      auVar140._6_2_ = uVar39 >> local_68;
      uVar41 = auVar137._8_2_;
      auVar140._8_2_ = uVar41 >> local_68;
      uVar43 = auVar137._10_2_;
      auVar140._10_2_ = uVar43 >> local_68;
      uVar45 = auVar137._12_2_;
      uVar47 = auVar137._14_2_;
      auVar140._12_2_ = uVar45 >> local_68;
      auVar140._14_2_ = uVar47 >> local_68;
      uVar88 = auVar153._0_2_;
      auVar186._0_2_ = uVar88 >> local_68;
      uVar93 = auVar153._2_2_;
      auVar186._2_2_ = uVar93 >> local_68;
      uVar95 = auVar153._4_2_;
      auVar186._4_2_ = uVar95 >> local_68;
      uVar97 = auVar153._6_2_;
      auVar186._6_2_ = uVar97 >> local_68;
      uVar99 = auVar153._8_2_;
      auVar186._8_2_ = uVar99 >> local_68;
      uVar101 = auVar153._10_2_;
      auVar186._10_2_ = uVar101 >> local_68;
      uVar103 = auVar153._12_2_;
      uVar104 = auVar153._14_2_;
      auVar186._12_2_ = uVar103 >> local_68;
      auVar186._14_2_ = uVar104 >> local_68;
      auVar79 = psubusw(auVar121,auVar140);
      auVar153 = psubusw(auVar121,auVar186);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar153._0_2_;
      sVar36 = auVar153._2_2_;
      sVar38 = auVar153._4_2_;
      sVar40 = auVar153._6_2_;
      sVar42 = auVar153._8_2_;
      sVar44 = auVar153._10_2_;
      sVar46 = auVar153._12_2_;
      sVar48 = auVar153._14_2_;
      auVar156._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar139._0_2_;
      auVar156._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar139._2_2_;
      auVar156._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar139._4_2_;
      auVar156._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar139._6_2_;
      auVar156._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar139._8_2_;
      auVar156._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar139._10_2_;
      auVar156._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar139._12_2_;
      auVar156._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar139._14_2_;
      auVar141._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar66._0_2_;
      auVar141._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar66._2_2_;
      auVar141._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar66._4_2_;
      auVar141._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar66._6_2_;
      auVar141._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar66._8_2_;
      auVar141._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar66._10_2_;
      auVar141._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar66._12_2_;
      auVar141._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar66._14_2_;
      auVar156 = auVar156 ^ auVar139;
      auVar157._0_2_ = auVar156._0_2_ + auVar67._0_2_;
      auVar157._2_2_ = auVar156._2_2_ + auVar67._2_2_;
      auVar157._4_2_ = auVar156._4_2_ + auVar67._4_2_;
      auVar157._6_2_ = auVar156._6_2_ + auVar67._6_2_;
      auVar157._8_2_ = auVar156._8_2_ + auVar67._8_2_;
      auVar157._10_2_ = auVar156._10_2_ + auVar67._10_2_;
      auVar157._12_2_ = auVar156._12_2_ + auVar67._12_2_;
      auVar157._14_2_ = auVar156._14_2_ + auVar67._14_2_;
      auVar141 = auVar141 ^ auVar66;
      auVar142._0_2_ = auVar141._0_2_ + auVar28._0_2_;
      auVar142._2_2_ = auVar141._2_2_ + auVar28._2_2_;
      auVar142._4_2_ = auVar141._4_2_ + auVar28._4_2_;
      auVar142._6_2_ = auVar141._6_2_ + auVar28._6_2_;
      auVar142._8_2_ = auVar141._8_2_ + auVar28._8_2_;
      auVar142._10_2_ = auVar141._10_2_ + auVar28._10_2_;
      auVar142._12_2_ = auVar141._12_2_ + auVar28._12_2_;
      auVar142._14_2_ = auVar141._14_2_ + auVar28._14_2_;
      auVar116._0_2_ = auVar115._0_2_ - sVar49;
      auVar116._2_2_ = auVar115._2_2_ - sVar51;
      auVar116._4_2_ = auVar115._4_2_ - sVar53;
      auVar116._6_2_ = auVar115._6_2_ - sVar55;
      auVar116._8_2_ = auVar115._8_2_ - sVar57;
      auVar116._10_2_ = auVar115._10_2_ - sVar59;
      auVar116._12_2_ = auVar115._12_2_ - sVar61;
      auVar116._14_2_ = auVar115._14_2_ - sVar63;
      auVar108._0_2_ = auVar107._0_2_ - sVar87;
      auVar108._2_2_ = auVar107._2_2_ - sVar92;
      auVar108._4_2_ = auVar107._4_2_ - sVar94;
      auVar108._6_2_ = auVar107._6_2_ - sVar96;
      auVar108._8_2_ = auVar107._8_2_ - sVar98;
      auVar108._10_2_ = auVar107._10_2_ - sVar100;
      auVar108._12_2_ = auVar107._12_2_ - sVar102;
      auVar108._14_2_ = auVar107._14_2_ - sVar64;
      auVar153 = pabsw(auVar137,auVar116);
      auVar107 = psraw(auVar116,0xf);
      auVar137 = pabsw(auVar66,auVar108);
      auVar79 = psraw(auVar108,0xf);
      uVar21 = auVar153._0_2_;
      auVar29._0_2_ = uVar21 >> local_68;
      uVar35 = auVar153._2_2_;
      auVar29._2_2_ = uVar35 >> local_68;
      uVar37 = auVar153._4_2_;
      auVar29._4_2_ = uVar37 >> local_68;
      uVar39 = auVar153._6_2_;
      auVar29._6_2_ = uVar39 >> local_68;
      uVar41 = auVar153._8_2_;
      auVar29._8_2_ = uVar41 >> local_68;
      uVar43 = auVar153._10_2_;
      auVar29._10_2_ = uVar43 >> local_68;
      uVar45 = auVar153._12_2_;
      uVar47 = auVar153._14_2_;
      auVar29._12_2_ = uVar45 >> local_68;
      auVar29._14_2_ = uVar47 >> local_68;
      uVar88 = auVar137._0_2_;
      auVar169._0_2_ = uVar88 >> local_68;
      uVar93 = auVar137._2_2_;
      auVar169._2_2_ = uVar93 >> local_68;
      uVar95 = auVar137._4_2_;
      auVar169._4_2_ = uVar95 >> local_68;
      uVar97 = auVar137._6_2_;
      auVar169._6_2_ = uVar97 >> local_68;
      uVar99 = auVar137._8_2_;
      auVar169._8_2_ = uVar99 >> local_68;
      uVar101 = auVar137._10_2_;
      auVar169._10_2_ = uVar101 >> local_68;
      uVar103 = auVar137._12_2_;
      uVar104 = auVar137._14_2_;
      auVar169._12_2_ = uVar103 >> local_68;
      auVar169._14_2_ = uVar104 >> local_68;
      auVar66 = psubusw(auVar121,auVar29);
      auVar137 = psubusw(auVar121,auVar169);
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      sVar22 = auVar137._0_2_;
      sVar36 = auVar137._2_2_;
      sVar38 = auVar137._4_2_;
      sVar40 = auVar137._6_2_;
      sVar42 = auVar137._8_2_;
      sVar44 = auVar137._10_2_;
      sVar46 = auVar137._12_2_;
      sVar48 = auVar137._14_2_;
      auVar68._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar107._0_2_;
      auVar68._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar107._2_2_;
      auVar68._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar107._4_2_;
      auVar68._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar107._6_2_;
      auVar68._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar107._8_2_;
      auVar68._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar107._10_2_;
      auVar68._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar107._12_2_;
      auVar68._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar107._14_2_;
      auVar30._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar79._0_2_;
      auVar30._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar79._2_2_;
      auVar30._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar79._4_2_;
      auVar30._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar79._6_2_;
      auVar30._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar79._8_2_;
      auVar30._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar79._10_2_;
      auVar30._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar79._12_2_;
      auVar30._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar79._14_2_;
      auVar68 = auVar68 ^ auVar107;
      auVar30 = auVar30 ^ auVar79;
      auVar132._0_2_ = auVar131._0_2_ - sVar49;
      auVar132._2_2_ = auVar131._2_2_ - sVar51;
      auVar132._4_2_ = auVar131._4_2_ - sVar53;
      auVar132._6_2_ = auVar131._6_2_ - sVar55;
      auVar132._8_2_ = auVar131._8_2_ - sVar57;
      auVar132._10_2_ = auVar131._10_2_ - sVar59;
      auVar132._12_2_ = auVar131._12_2_ - sVar61;
      auVar132._14_2_ = auVar131._14_2_ - sVar63;
      auVar106._0_2_ = auVar105._0_2_ - sVar87;
      auVar106._2_2_ = auVar105._2_2_ - sVar92;
      auVar106._4_2_ = auVar105._4_2_ - sVar94;
      auVar106._6_2_ = auVar105._6_2_ - sVar96;
      auVar106._8_2_ = auVar105._8_2_ - sVar98;
      auVar106._10_2_ = auVar105._10_2_ - sVar100;
      auVar106._12_2_ = auVar105._12_2_ - sVar102;
      auVar106._14_2_ = auVar105._14_2_ - sVar64;
      auVar153 = pabsw(auVar153,auVar132);
      auVar107 = psraw(auVar132,0xf);
      uVar21 = auVar153._0_2_;
      auVar81._0_2_ = uVar21 >> local_68;
      uVar35 = auVar153._2_2_;
      auVar81._2_2_ = uVar35 >> local_68;
      uVar37 = auVar153._4_2_;
      auVar81._4_2_ = uVar37 >> local_68;
      uVar39 = auVar153._6_2_;
      auVar81._6_2_ = uVar39 >> local_68;
      uVar41 = auVar153._8_2_;
      auVar81._8_2_ = uVar41 >> local_68;
      uVar43 = auVar153._10_2_;
      auVar81._10_2_ = uVar43 >> local_68;
      uVar45 = auVar153._12_2_;
      uVar47 = auVar153._14_2_;
      auVar81._12_2_ = uVar45 >> local_68;
      auVar81._14_2_ = uVar47 >> local_68;
      auVar115 = pabsw(auVar169,auVar106);
      uVar88 = auVar115._0_2_;
      auVar177._0_2_ = uVar88 >> local_68;
      uVar93 = auVar115._2_2_;
      auVar177._2_2_ = uVar93 >> local_68;
      uVar95 = auVar115._4_2_;
      auVar177._4_2_ = uVar95 >> local_68;
      uVar97 = auVar115._6_2_;
      auVar177._6_2_ = uVar97 >> local_68;
      uVar99 = auVar115._8_2_;
      auVar177._8_2_ = uVar99 >> local_68;
      uVar101 = auVar115._10_2_;
      auVar177._10_2_ = uVar101 >> local_68;
      uVar103 = auVar115._12_2_;
      uVar104 = auVar115._14_2_;
      auVar177._12_2_ = uVar103 >> local_68;
      auVar177._14_2_ = uVar104 >> local_68;
      auVar137 = psraw(auVar106,0xf);
      auVar79 = psubusw(auVar121,auVar81);
      auVar66 = psubusw(auVar121,auVar177);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar66._0_2_;
      sVar36 = auVar66._2_2_;
      sVar38 = auVar66._4_2_;
      sVar40 = auVar66._6_2_;
      sVar42 = auVar66._8_2_;
      sVar44 = auVar66._10_2_;
      sVar46 = auVar66._12_2_;
      sVar48 = auVar66._14_2_;
      auVar117._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar107._0_2_;
      auVar117._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar107._2_2_;
      auVar117._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar107._4_2_;
      auVar117._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar107._6_2_;
      auVar117._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar107._8_2_;
      auVar117._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar107._10_2_;
      auVar117._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar107._12_2_;
      auVar117._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar107._14_2_;
      auVar109._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar137._0_2_;
      auVar109._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar137._2_2_;
      auVar109._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar137._4_2_;
      auVar109._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar137._6_2_;
      auVar109._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar137._8_2_;
      auVar109._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar137._10_2_;
      auVar109._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar137._12_2_;
      auVar109._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar137._14_2_;
      auVar117 = auVar117 ^ auVar107;
      auVar109 = auVar109 ^ auVar137;
      auVar79 = lddqu(auVar157,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar15 * 2));
      auVar66 = lddqu(auVar142,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar15 * 2));
      auVar105 = lddqu(auVar81,*(undefined1 (*) [16])((long)in + lVar15 * -2));
      auVar139 = lddqu(auVar186,*(undefined1 (*) [16])((long)in + lVar15 * -2 + 0x120));
      auVar107 = lddqu(auVar107,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar20 * 2));
      auVar137 = lddqu(auVar30,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar20 * 2));
      auVar158._0_2_ = auVar79._0_2_ - sVar49;
      auVar158._2_2_ = auVar79._2_2_ - sVar51;
      auVar158._4_2_ = auVar79._4_2_ - sVar53;
      auVar158._6_2_ = auVar79._6_2_ - sVar55;
      auVar158._8_2_ = auVar79._8_2_ - sVar57;
      auVar158._10_2_ = auVar79._10_2_ - sVar59;
      auVar158._12_2_ = auVar79._12_2_ - sVar61;
      auVar158._14_2_ = auVar79._14_2_ - sVar63;
      auVar143._0_2_ = auVar66._0_2_ - sVar87;
      auVar143._2_2_ = auVar66._2_2_ - sVar92;
      auVar143._4_2_ = auVar66._4_2_ - sVar94;
      auVar143._6_2_ = auVar66._6_2_ - sVar96;
      auVar143._8_2_ = auVar66._8_2_ - sVar98;
      auVar143._10_2_ = auVar66._10_2_ - sVar100;
      auVar143._12_2_ = auVar66._12_2_ - sVar102;
      auVar143._14_2_ = auVar66._14_2_ - sVar64;
      auVar66 = pabsw(auVar153,auVar158);
      auVar131 = psraw(auVar158,0xf);
      uVar21 = auVar66._0_2_;
      auVar31._0_2_ = uVar21 >> local_68;
      uVar35 = auVar66._2_2_;
      auVar31._2_2_ = uVar35 >> local_68;
      uVar37 = auVar66._4_2_;
      auVar31._4_2_ = uVar37 >> local_68;
      uVar39 = auVar66._6_2_;
      auVar31._6_2_ = uVar39 >> local_68;
      uVar41 = auVar66._8_2_;
      auVar31._8_2_ = uVar41 >> local_68;
      uVar43 = auVar66._10_2_;
      auVar31._10_2_ = uVar43 >> local_68;
      uVar45 = auVar66._12_2_;
      uVar47 = auVar66._14_2_;
      auVar31._12_2_ = uVar45 >> local_68;
      auVar31._14_2_ = uVar47 >> local_68;
      auVar153 = pabsw(auVar115,auVar143);
      uVar88 = auVar153._0_2_;
      auVar178._0_2_ = uVar88 >> local_68;
      uVar93 = auVar153._2_2_;
      auVar178._2_2_ = uVar93 >> local_68;
      uVar95 = auVar153._4_2_;
      auVar178._4_2_ = uVar95 >> local_68;
      uVar97 = auVar153._6_2_;
      auVar178._6_2_ = uVar97 >> local_68;
      uVar99 = auVar153._8_2_;
      auVar178._8_2_ = uVar99 >> local_68;
      uVar101 = auVar153._10_2_;
      auVar178._10_2_ = uVar101 >> local_68;
      uVar103 = auVar153._12_2_;
      uVar104 = auVar153._14_2_;
      auVar178._12_2_ = uVar103 >> local_68;
      auVar178._14_2_ = uVar104 >> local_68;
      auVar115 = psraw(auVar143,0xf);
      auVar79 = psubusw(auVar121,auVar31);
      auVar153 = psubusw(auVar121,auVar178);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar153._0_2_;
      sVar36 = auVar153._2_2_;
      sVar38 = auVar153._4_2_;
      sVar40 = auVar153._6_2_;
      sVar42 = auVar153._8_2_;
      sVar44 = auVar153._10_2_;
      sVar46 = auVar153._12_2_;
      sVar48 = auVar153._14_2_;
      auVar69._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar131._0_2_;
      auVar69._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar131._2_2_;
      auVar69._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar131._4_2_;
      auVar69._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar131._6_2_;
      auVar69._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar131._8_2_;
      auVar69._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar131._10_2_;
      auVar69._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar131._12_2_;
      auVar69._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar131._14_2_;
      auVar32._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar115._0_2_;
      auVar32._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar115._2_2_;
      auVar32._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar115._4_2_;
      auVar32._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar115._6_2_;
      auVar32._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar115._8_2_;
      auVar32._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar115._10_2_;
      auVar32._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar115._12_2_;
      auVar32._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar115._14_2_;
      auVar69 = auVar69 ^ auVar131;
      auVar82._0_2_ = auVar105._0_2_ - sVar49;
      auVar82._2_2_ = auVar105._2_2_ - sVar51;
      auVar82._4_2_ = auVar105._4_2_ - sVar53;
      auVar82._6_2_ = auVar105._6_2_ - sVar55;
      auVar82._8_2_ = auVar105._8_2_ - sVar57;
      auVar82._10_2_ = auVar105._10_2_ - sVar59;
      auVar82._12_2_ = auVar105._12_2_ - sVar61;
      auVar82._14_2_ = auVar105._14_2_ - sVar63;
      auVar187._0_2_ = auVar139._0_2_ - sVar87;
      auVar187._2_2_ = auVar139._2_2_ - sVar92;
      auVar187._4_2_ = auVar139._4_2_ - sVar94;
      auVar187._6_2_ = auVar139._6_2_ - sVar96;
      auVar187._8_2_ = auVar139._8_2_ - sVar98;
      auVar187._10_2_ = auVar139._10_2_ - sVar100;
      auVar187._12_2_ = auVar139._12_2_ - sVar102;
      auVar187._14_2_ = auVar139._14_2_ - sVar64;
      auVar153 = pabsw(auVar66,auVar82);
      uVar21 = auVar153._0_2_;
      auVar170._0_2_ = uVar21 >> local_68;
      uVar35 = auVar153._2_2_;
      auVar170._2_2_ = uVar35 >> local_68;
      uVar37 = auVar153._4_2_;
      auVar170._4_2_ = uVar37 >> local_68;
      uVar39 = auVar153._6_2_;
      auVar170._6_2_ = uVar39 >> local_68;
      uVar41 = auVar153._8_2_;
      auVar170._8_2_ = uVar41 >> local_68;
      uVar43 = auVar153._10_2_;
      auVar170._10_2_ = uVar43 >> local_68;
      uVar45 = auVar153._12_2_;
      uVar47 = auVar153._14_2_;
      auVar170._12_2_ = uVar45 >> local_68;
      auVar170._14_2_ = uVar47 >> local_68;
      auVar66 = pabsw(*pauVar1,auVar187);
      uVar88 = auVar66._0_2_;
      auVar179._0_2_ = uVar88 >> local_68;
      uVar93 = auVar66._2_2_;
      auVar179._2_2_ = uVar93 >> local_68;
      uVar95 = auVar66._4_2_;
      auVar179._4_2_ = uVar95 >> local_68;
      uVar97 = auVar66._6_2_;
      auVar179._6_2_ = uVar97 >> local_68;
      uVar99 = auVar66._8_2_;
      auVar179._8_2_ = uVar99 >> local_68;
      uVar101 = auVar66._10_2_;
      auVar179._10_2_ = uVar101 >> local_68;
      uVar103 = auVar66._12_2_;
      uVar104 = auVar66._14_2_;
      auVar179._12_2_ = uVar103 >> local_68;
      auVar179._14_2_ = uVar104 >> local_68;
      auVar32 = auVar32 ^ auVar115;
      auVar66 = psubusw(auVar121,auVar170);
      auVar79 = psubusw(auVar121,auVar179);
      auVar115 = lddqu(auVar179,*(undefined1 (*) [16])((long)in + lVar20 * -2));
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      auVar105 = lddqu(auVar170,*(undefined1 (*) [16])((long)in + lVar20 * -2 + 0x120));
      auVar66 = psraw(auVar82,0xf);
      auVar131 = psraw(auVar187,0xf);
      sVar22 = auVar79._0_2_;
      sVar36 = auVar79._2_2_;
      sVar38 = auVar79._4_2_;
      sVar40 = auVar79._6_2_;
      sVar42 = auVar79._8_2_;
      sVar44 = auVar79._10_2_;
      sVar46 = auVar79._12_2_;
      sVar48 = auVar79._14_2_;
      auVar159._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar66._0_2_;
      auVar159._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar66._2_2_;
      auVar159._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar66._4_2_;
      auVar159._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar66._6_2_;
      auVar159._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar66._8_2_;
      auVar159._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar66._10_2_;
      auVar159._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar66._12_2_;
      auVar159._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar66._14_2_;
      auVar144._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar131._0_2_;
      auVar144._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar131._2_2_;
      auVar144._4_2_ =
           (((short)uVar95 < sVar38) * uVar95 | (ushort)((short)uVar95 >= sVar38) * sVar38) +
           auVar131._4_2_;
      auVar144._6_2_ =
           (((short)uVar97 < sVar40) * uVar97 | (ushort)((short)uVar97 >= sVar40) * sVar40) +
           auVar131._6_2_;
      auVar144._8_2_ =
           (((short)uVar99 < sVar42) * uVar99 | (ushort)((short)uVar99 >= sVar42) * sVar42) +
           auVar131._8_2_;
      auVar144._10_2_ =
           (((short)uVar101 < sVar44) * uVar101 | (ushort)((short)uVar101 >= sVar44) * sVar44) +
           auVar131._10_2_;
      auVar144._12_2_ =
           (((short)uVar103 < sVar46) * uVar103 | (ushort)((short)uVar103 >= sVar46) * sVar46) +
           auVar131._12_2_;
      auVar144._14_2_ =
           (((short)uVar104 < sVar48) * uVar104 | (ushort)((short)uVar104 >= sVar48) * sVar48) +
           auVar131._14_2_;
      auVar159 = auVar159 ^ auVar66;
      in_XMM12._0_2_ = auVar159._0_2_ + auVar69._0_2_;
      in_XMM12._2_2_ = auVar159._2_2_ + auVar69._2_2_;
      in_XMM12._4_2_ = auVar159._4_2_ + auVar69._4_2_;
      in_XMM12._6_2_ = auVar159._6_2_ + auVar69._6_2_;
      in_XMM12._8_2_ = auVar159._8_2_ + auVar69._8_2_;
      in_XMM12._10_2_ = auVar159._10_2_ + auVar69._10_2_;
      in_XMM12._12_2_ = auVar159._12_2_ + auVar69._12_2_;
      in_XMM12._14_2_ = auVar159._14_2_ + auVar69._14_2_;
      auVar144 = auVar144 ^ auVar131;
      in_XMM11._0_2_ = auVar144._0_2_ + auVar32._0_2_;
      in_XMM11._2_2_ = auVar144._2_2_ + auVar32._2_2_;
      in_XMM11._4_2_ = auVar144._4_2_ + auVar32._4_2_;
      in_XMM11._6_2_ = auVar144._6_2_ + auVar32._6_2_;
      in_XMM11._8_2_ = auVar144._8_2_ + auVar32._8_2_;
      in_XMM11._10_2_ = auVar144._10_2_ + auVar32._10_2_;
      in_XMM11._12_2_ = auVar144._12_2_ + auVar32._12_2_;
      in_XMM11._14_2_ = auVar144._14_2_ + auVar32._14_2_;
      auVar133._0_2_ = auVar107._0_2_ - sVar49;
      auVar133._2_2_ = auVar107._2_2_ - sVar51;
      auVar133._4_2_ = auVar107._4_2_ - sVar53;
      auVar133._6_2_ = auVar107._6_2_ - sVar55;
      auVar133._8_2_ = auVar107._8_2_ - sVar57;
      auVar133._10_2_ = auVar107._10_2_ - sVar59;
      auVar133._12_2_ = auVar107._12_2_ - sVar61;
      auVar133._14_2_ = auVar107._14_2_ - sVar63;
      local_88._0_2_ = auVar137._0_2_;
      local_88._2_2_ = auVar137._2_2_;
      local_88._4_2_ = auVar137._4_2_;
      local_88._6_2_ = auVar137._6_2_;
      local_88._8_2_ = auVar137._8_2_;
      local_88._10_2_ = auVar137._10_2_;
      local_88._12_2_ = auVar137._12_2_;
      local_88._14_2_ = auVar137._14_2_;
      auVar33._0_2_ = local_88._0_2_ - sVar87;
      auVar33._2_2_ = local_88._2_2_ - sVar92;
      auVar33._4_2_ = local_88._4_2_ - sVar94;
      auVar33._6_2_ = local_88._6_2_ - sVar96;
      auVar33._8_2_ = local_88._8_2_ - sVar98;
      auVar33._10_2_ = local_88._10_2_ - sVar100;
      auVar33._12_2_ = local_88._12_2_ - sVar102;
      auVar33._14_2_ = local_88._14_2_ - sVar64;
      auVar153 = pabsw(auVar153,auVar133);
      auVar79 = psraw(auVar133,0xf);
      uVar21 = auVar153._0_2_;
      auVar70._0_2_ = uVar21 >> local_68;
      uVar35 = auVar153._2_2_;
      auVar70._2_2_ = uVar35 >> local_68;
      uVar37 = auVar153._4_2_;
      auVar70._4_2_ = uVar37 >> local_68;
      uVar39 = auVar153._6_2_;
      auVar70._6_2_ = uVar39 >> local_68;
      uVar41 = auVar153._8_2_;
      auVar70._8_2_ = uVar41 >> local_68;
      uVar43 = auVar153._10_2_;
      auVar70._10_2_ = uVar43 >> local_68;
      uVar45 = auVar153._12_2_;
      uVar47 = auVar153._14_2_;
      auVar70._12_2_ = uVar45 >> local_68;
      auVar70._14_2_ = uVar47 >> local_68;
      auVar137 = pabsw(auVar66,auVar33);
      uVar88 = auVar137._0_2_;
      auVar91._0_2_ = uVar88 >> local_68;
      uVar93 = auVar137._2_2_;
      auVar91._2_2_ = uVar93 >> local_68;
      uVar95 = auVar137._4_2_;
      auVar91._4_2_ = uVar95 >> local_68;
      uVar97 = auVar137._6_2_;
      auVar91._6_2_ = uVar97 >> local_68;
      uVar99 = auVar137._8_2_;
      auVar91._8_2_ = uVar99 >> local_68;
      uVar101 = auVar137._10_2_;
      auVar91._10_2_ = uVar101 >> local_68;
      uVar103 = auVar137._12_2_;
      uVar104 = auVar137._14_2_;
      auVar91._12_2_ = uVar103 >> local_68;
      auVar91._14_2_ = uVar104 >> local_68;
      in_XMM6 = psraw(auVar33,0xf);
      auVar137 = psubusw(auVar121,auVar70);
      auVar66 = psubusw(auVar121,auVar91);
      sVar22 = auVar137._0_2_;
      sVar36 = auVar137._2_2_;
      sVar38 = auVar137._4_2_;
      sVar40 = auVar137._6_2_;
      sVar42 = auVar137._8_2_;
      sVar44 = auVar137._10_2_;
      sVar46 = auVar137._12_2_;
      sVar48 = auVar137._14_2_;
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      auVar34._0_2_ =
           (((short)uVar21 < sVar22) * uVar21 | (ushort)((short)uVar21 >= sVar22) * sVar22) +
           auVar79._0_2_;
      auVar34._2_2_ =
           (((short)uVar35 < sVar36) * uVar35 | (ushort)((short)uVar35 >= sVar36) * sVar36) +
           auVar79._2_2_;
      auVar34._4_2_ =
           (((short)uVar37 < sVar38) * uVar37 | (ushort)((short)uVar37 >= sVar38) * sVar38) +
           auVar79._4_2_;
      auVar34._6_2_ =
           (((short)uVar39 < sVar40) * uVar39 | (ushort)((short)uVar39 >= sVar40) * sVar40) +
           auVar79._6_2_;
      auVar34._8_2_ =
           (((short)uVar41 < sVar42) * uVar41 | (ushort)((short)uVar41 >= sVar42) * sVar42) +
           auVar79._8_2_;
      auVar34._10_2_ =
           (((short)uVar43 < sVar44) * uVar43 | (ushort)((short)uVar43 >= sVar44) * sVar44) +
           auVar79._10_2_;
      auVar34._12_2_ =
           (((short)uVar45 < sVar46) * uVar45 | (ushort)((short)uVar45 >= sVar46) * sVar46) +
           auVar79._12_2_;
      auVar34._14_2_ =
           (((short)uVar47 < sVar48) * uVar47 | (ushort)((short)uVar47 >= sVar48) * sVar48) +
           auVar79._14_2_;
      auVar188._0_2_ =
           (((short)uVar88 < sVar65) * uVar88 | (ushort)((short)uVar88 >= sVar65) * sVar65) +
           in_XMM6._0_2_;
      auVar188._2_2_ =
           (((short)uVar93 < sVar72) * uVar93 | (ushort)((short)uVar93 >= sVar72) * sVar72) +
           in_XMM6._2_2_;
      auVar188._4_2_ =
           (((short)uVar95 < sVar73) * uVar95 | (ushort)((short)uVar95 >= sVar73) * sVar73) +
           in_XMM6._4_2_;
      auVar188._6_2_ =
           (((short)uVar97 < sVar74) * uVar97 | (ushort)((short)uVar97 >= sVar74) * sVar74) +
           in_XMM6._6_2_;
      auVar188._8_2_ =
           (((short)uVar99 < sVar75) * uVar99 | (ushort)((short)uVar99 >= sVar75) * sVar75) +
           in_XMM6._8_2_;
      auVar188._10_2_ =
           (((short)uVar101 < sVar76) * uVar101 | (ushort)((short)uVar101 >= sVar76) * sVar76) +
           in_XMM6._10_2_;
      auVar188._12_2_ =
           (((short)uVar103 < sVar77) * uVar103 | (ushort)((short)uVar103 >= sVar77) * sVar77) +
           in_XMM6._12_2_;
      auVar188._14_2_ =
           (((short)uVar104 < sVar78) * uVar104 | (ushort)((short)uVar104 >= sVar78) * sVar78) +
           in_XMM6._14_2_;
      auVar34 = auVar34 ^ auVar79;
      auVar180._0_2_ = auVar115._0_2_ - sVar49;
      auVar180._2_2_ = auVar115._2_2_ - sVar51;
      auVar180._4_2_ = auVar115._4_2_ - sVar53;
      auVar180._6_2_ = auVar115._6_2_ - sVar55;
      auVar180._8_2_ = auVar115._8_2_ - sVar57;
      auVar180._10_2_ = auVar115._10_2_ - sVar59;
      auVar180._12_2_ = auVar115._12_2_ - sVar61;
      auVar180._14_2_ = auVar115._14_2_ - sVar63;
      auVar171._0_2_ = auVar105._0_2_ - sVar50;
      auVar171._2_2_ = auVar105._2_2_ - sVar52;
      auVar171._4_2_ = auVar105._4_2_ - sVar54;
      auVar171._6_2_ = auVar105._6_2_ - sVar56;
      auVar171._8_2_ = auVar105._8_2_ - sVar58;
      auVar171._10_2_ = auVar105._10_2_ - sVar60;
      auVar171._12_2_ = auVar105._12_2_ - sVar62;
      auVar171._14_2_ = auVar105._14_2_ - sVar64;
      auVar137 = pabsw(auVar153,auVar180);
      uVar21 = auVar137._0_2_;
      auVar71._0_2_ = uVar21 >> local_68;
      uVar35 = auVar137._2_2_;
      auVar71._2_2_ = uVar35 >> local_68;
      uVar37 = auVar137._4_2_;
      auVar71._4_2_ = uVar37 >> local_68;
      uVar39 = auVar137._6_2_;
      auVar71._6_2_ = uVar39 >> local_68;
      uVar41 = auVar137._8_2_;
      auVar71._8_2_ = uVar41 >> local_68;
      uVar43 = auVar137._10_2_;
      auVar71._10_2_ = uVar43 >> local_68;
      uVar45 = auVar137._12_2_;
      uVar47 = auVar137._14_2_;
      auVar71._12_2_ = uVar45 >> local_68;
      auVar71._14_2_ = uVar47 >> local_68;
      auVar137 = pabsw(auVar91,auVar171);
      uVar88 = auVar137._0_2_;
      in_XMM10._0_2_ = uVar88 >> local_68;
      uVar93 = auVar137._2_2_;
      in_XMM10._2_2_ = uVar93 >> local_68;
      uVar95 = auVar137._4_2_;
      in_XMM10._4_2_ = uVar95 >> local_68;
      uVar97 = auVar137._6_2_;
      in_XMM10._6_2_ = uVar97 >> local_68;
      uVar99 = auVar137._8_2_;
      in_XMM10._8_2_ = uVar99 >> local_68;
      uVar101 = auVar137._10_2_;
      in_XMM10._10_2_ = uVar101 >> local_68;
      uVar103 = auVar137._12_2_;
      uVar104 = auVar137._14_2_;
      in_XMM10._12_2_ = uVar103 >> local_68;
      in_XMM10._14_2_ = uVar104 >> local_68;
      auVar188 = auVar188 ^ in_XMM6;
      auVar137 = psubusw(auVar121,auVar71);
      auVar121 = psubusw(auVar121,in_XMM10);
      sVar22 = auVar137._0_2_;
      sVar36 = auVar137._2_2_;
      sVar38 = auVar137._4_2_;
      sVar40 = auVar137._6_2_;
      sVar42 = auVar137._8_2_;
      sVar44 = auVar137._10_2_;
      sVar46 = auVar137._12_2_;
      sVar48 = auVar137._14_2_;
      sVar65 = auVar121._0_2_;
      sVar72 = auVar121._2_2_;
      sVar73 = auVar121._4_2_;
      sVar74 = auVar121._6_2_;
      sVar75 = auVar121._8_2_;
      sVar76 = auVar121._10_2_;
      sVar77 = auVar121._12_2_;
      sVar78 = auVar121._14_2_;
      in_XMM14 = psraw(auVar180,0xf);
      auVar83._0_2_ =
           (((short)uVar21 < sVar22) * uVar21 | (ushort)((short)uVar21 >= sVar22) * sVar22) +
           in_XMM14._0_2_;
      auVar83._2_2_ =
           (((short)uVar35 < sVar36) * uVar35 | (ushort)((short)uVar35 >= sVar36) * sVar36) +
           in_XMM14._2_2_;
      auVar83._4_2_ =
           (((short)uVar37 < sVar38) * uVar37 | (ushort)((short)uVar37 >= sVar38) * sVar38) +
           in_XMM14._4_2_;
      auVar83._6_2_ =
           (((short)uVar39 < sVar40) * uVar39 | (ushort)((short)uVar39 >= sVar40) * sVar40) +
           in_XMM14._6_2_;
      auVar83._8_2_ =
           (((short)uVar41 < sVar42) * uVar41 | (ushort)((short)uVar41 >= sVar42) * sVar42) +
           in_XMM14._8_2_;
      auVar83._10_2_ =
           (((short)uVar43 < sVar44) * uVar43 | (ushort)((short)uVar43 >= sVar44) * sVar44) +
           in_XMM14._10_2_;
      auVar83._12_2_ =
           (((short)uVar45 < sVar46) * uVar45 | (ushort)((short)uVar45 >= sVar46) * sVar46) +
           in_XMM14._12_2_;
      auVar83._14_2_ =
           (((short)uVar47 < sVar48) * uVar47 | (ushort)((short)uVar47 >= sVar48) * sVar48) +
           in_XMM14._14_2_;
      auVar83 = auVar83 ^ in_XMM14;
      in_XMM13 = psraw(auVar171,0xf);
      auVar122._0_2_ =
           (((short)uVar88 < sVar65) * uVar88 | (ushort)((short)uVar88 >= sVar65) * sVar65) +
           in_XMM13._0_2_;
      auVar122._2_2_ =
           (((short)uVar93 < sVar72) * uVar93 | (ushort)((short)uVar93 >= sVar72) * sVar72) +
           in_XMM13._2_2_;
      auVar122._4_2_ =
           (((short)uVar95 < sVar73) * uVar95 | (ushort)((short)uVar95 >= sVar73) * sVar73) +
           in_XMM13._4_2_;
      auVar122._6_2_ =
           (((short)uVar97 < sVar74) * uVar97 | (ushort)((short)uVar97 >= sVar74) * sVar74) +
           in_XMM13._6_2_;
      auVar122._8_2_ =
           (((short)uVar99 < sVar75) * uVar99 | (ushort)((short)uVar99 >= sVar75) * sVar75) +
           in_XMM13._8_2_;
      auVar122._10_2_ =
           (((short)uVar101 < sVar76) * uVar101 | (ushort)((short)uVar101 >= sVar76) * sVar76) +
           in_XMM13._10_2_;
      auVar122._12_2_ =
           (((short)uVar103 < sVar77) * uVar103 | (ushort)((short)uVar103 >= sVar77) * sVar77) +
           in_XMM13._12_2_;
      auVar122._14_2_ =
           (((short)uVar104 < sVar78) * uVar104 | (ushort)((short)uVar104 >= sVar78) * sVar78) +
           in_XMM13._14_2_;
      auVar122 = auVar122 ^ in_XMM13;
      local_48 = auVar25._0_2_;
      sStack_46 = auVar25._2_2_;
      in_XMM8._0_2_ = (auVar117._0_2_ + auVar68._0_2_ + auVar157._0_2_) * local_48;
      in_XMM8._2_2_ = (auVar117._2_2_ + auVar68._2_2_ + auVar157._2_2_) * sStack_46;
      in_XMM8._4_2_ = (auVar117._4_2_ + auVar68._4_2_ + auVar157._4_2_) * local_48;
      in_XMM8._6_2_ = (auVar117._6_2_ + auVar68._6_2_ + auVar157._6_2_) * sStack_46;
      in_XMM8._8_2_ = (auVar117._8_2_ + auVar68._8_2_ + auVar157._8_2_) * local_48;
      in_XMM8._10_2_ = (auVar117._10_2_ + auVar68._10_2_ + auVar157._10_2_) * sStack_46;
      in_XMM8._12_2_ = (auVar117._12_2_ + auVar68._12_2_ + auVar157._12_2_) * local_48;
      in_XMM8._14_2_ = (auVar117._14_2_ + auVar68._14_2_ + auVar157._14_2_) * sStack_46;
      auVar12._4_4_ = uVar24;
      auVar12._0_4_ = uVar24;
      auVar12._8_4_ = uVar24;
      auVar12._12_4_ = uVar24;
      sVar22 = auVar26._0_2_;
      sVar36 = auVar26._2_2_;
      auVar84._0_2_ = (auVar83._0_2_ + auVar34._0_2_ + in_XMM12._0_2_) * sVar22 + in_XMM8._0_2_;
      auVar84._2_2_ = (auVar83._2_2_ + auVar34._2_2_ + in_XMM12._2_2_) * sVar36 + in_XMM8._2_2_;
      auVar84._4_2_ = (auVar83._4_2_ + auVar34._4_2_ + in_XMM12._4_2_) * sVar22 + in_XMM8._4_2_;
      auVar84._6_2_ = (auVar83._6_2_ + auVar34._6_2_ + in_XMM12._6_2_) * sVar36 + in_XMM8._6_2_;
      auVar84._8_2_ = (auVar83._8_2_ + auVar34._8_2_ + in_XMM12._8_2_) * sVar22 + in_XMM8._8_2_;
      auVar84._10_2_ = (auVar83._10_2_ + auVar34._10_2_ + in_XMM12._10_2_) * sVar36 + in_XMM8._10_2_
      ;
      auVar84._12_2_ = (auVar83._12_2_ + auVar34._12_2_ + in_XMM12._12_2_) * sVar22 + in_XMM8._12_2_
      ;
      auVar84._14_2_ = (auVar83._14_2_ + auVar34._14_2_ + in_XMM12._14_2_) * sVar36 + in_XMM8._14_2_
      ;
      in_XMM7._0_2_ = (auVar109._0_2_ + auVar30._0_2_ + auVar142._0_2_) * local_48;
      in_XMM7._2_2_ = (auVar109._2_2_ + auVar30._2_2_ + auVar142._2_2_) * sStack_46;
      in_XMM7._4_2_ = (auVar109._4_2_ + auVar30._4_2_ + auVar142._4_2_) * local_48;
      in_XMM7._6_2_ = (auVar109._6_2_ + auVar30._6_2_ + auVar142._6_2_) * sStack_46;
      in_XMM7._8_2_ = (auVar109._8_2_ + auVar30._8_2_ + auVar142._8_2_) * local_48;
      in_XMM7._10_2_ = (auVar109._10_2_ + auVar30._10_2_ + auVar142._10_2_) * sStack_46;
      in_XMM7._12_2_ = (auVar109._12_2_ + auVar30._12_2_ + auVar142._12_2_) * local_48;
      in_XMM7._14_2_ = (auVar109._14_2_ + auVar30._14_2_ + auVar142._14_2_) * sStack_46;
      auVar123._0_2_ = (auVar122._0_2_ + auVar188._0_2_ + in_XMM11._0_2_) * sVar22 + in_XMM7._0_2_;
      auVar123._2_2_ = (auVar122._2_2_ + auVar188._2_2_ + in_XMM11._2_2_) * sVar36 + in_XMM7._2_2_;
      auVar123._4_2_ = (auVar122._4_2_ + auVar188._4_2_ + in_XMM11._4_2_) * sVar22 + in_XMM7._4_2_;
      auVar123._6_2_ = (auVar122._6_2_ + auVar188._6_2_ + in_XMM11._6_2_) * sVar36 + in_XMM7._6_2_;
      auVar123._8_2_ = (auVar122._8_2_ + auVar188._8_2_ + in_XMM11._8_2_) * sVar22 + in_XMM7._8_2_;
      auVar123._10_2_ =
           (auVar122._10_2_ + auVar188._10_2_ + in_XMM11._10_2_) * sVar36 + in_XMM7._10_2_;
      auVar123._12_2_ =
           (auVar122._12_2_ + auVar188._12_2_ + in_XMM11._12_2_) * sVar22 + in_XMM7._12_2_;
      auVar123._14_2_ =
           (auVar122._14_2_ + auVar188._14_2_ + in_XMM11._14_2_) * sVar36 + in_XMM7._14_2_;
      auVar121 = psraw(auVar84,0xf);
      auVar137 = pmovsxbw(auVar12,0x808080808080808);
      auVar85._0_2_ = auVar84._0_2_ + auVar137._0_2_ + auVar121._0_2_;
      auVar85._2_2_ = auVar84._2_2_ + auVar137._2_2_ + auVar121._2_2_;
      auVar85._4_2_ = auVar84._4_2_ + auVar137._4_2_ + auVar121._4_2_;
      auVar85._6_2_ = auVar84._6_2_ + auVar137._6_2_ + auVar121._6_2_;
      auVar85._8_2_ = auVar84._8_2_ + auVar137._8_2_ + auVar121._8_2_;
      auVar85._10_2_ = auVar84._10_2_ + auVar137._10_2_ + auVar121._10_2_;
      auVar85._12_2_ = auVar84._12_2_ + auVar137._12_2_ + auVar121._12_2_;
      auVar85._14_2_ = auVar84._14_2_ + auVar137._14_2_ + auVar121._14_2_;
      auVar121 = psraw(auVar123,0xf);
      auVar124._0_2_ = auVar123._0_2_ + auVar137._0_2_ + auVar121._0_2_;
      auVar124._2_2_ = auVar123._2_2_ + auVar137._2_2_ + auVar121._2_2_;
      auVar124._4_2_ = auVar123._4_2_ + auVar137._4_2_ + auVar121._4_2_;
      auVar124._6_2_ = auVar123._6_2_ + auVar137._6_2_ + auVar121._6_2_;
      auVar124._8_2_ = auVar123._8_2_ + auVar137._8_2_ + auVar121._8_2_;
      auVar124._10_2_ = auVar123._10_2_ + auVar137._10_2_ + auVar121._10_2_;
      auVar124._12_2_ = auVar123._12_2_ + auVar137._12_2_ + auVar121._12_2_;
      auVar124._14_2_ = auVar123._14_2_ + auVar137._14_2_ + auVar121._14_2_;
      auVar121 = psraw(auVar85,4);
      in_XMM4._0_2_ = auVar121._0_2_ + sVar49;
      in_XMM4._2_2_ = auVar121._2_2_ + sVar51;
      in_XMM4._4_2_ = auVar121._4_2_ + sVar53;
      in_XMM4._6_2_ = auVar121._6_2_ + sVar55;
      in_XMM4._8_2_ = auVar121._8_2_ + sVar57;
      in_XMM4._10_2_ = auVar121._10_2_ + sVar59;
      in_XMM4._12_2_ = auVar121._12_2_ + sVar61;
      in_XMM4._14_2_ = auVar121._14_2_ + sVar63;
      auVar121 = psraw(auVar124,4);
      *(undefined1 (*) [16])dest = in_XMM4;
      psVar2 = (short *)((long)*(undefined1 (*) [16])dest + (long)dstride * 2);
      *psVar2 = auVar121._0_2_ + sVar50;
      psVar2[1] = auVar121._2_2_ + sVar52;
      psVar2[2] = auVar121._4_2_ + sVar54;
      psVar2[3] = auVar121._6_2_ + sVar56;
      psVar2[4] = auVar121._8_2_ + sVar58;
      psVar2[5] = auVar121._10_2_ + sVar60;
      psVar2[6] = auVar121._12_2_ + sVar62;
      psVar2[7] = auVar121._14_2_ + sVar64;
      dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar11 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar11 == 0; iVar11 = iVar11 + -1) {
        }
      }
      uVar16 = sec_damping - iVar11;
      if (sec_damping < iVar11) {
        uVar16 = 0;
      }
    }
    auVar25 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar26 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    local_98 = auVar26._0_2_;
    sStack_96 = auVar26._2_2_;
    auVar121 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    local_88._4_4_ = auVar121._0_4_;
    local_88._0_4_ = local_88._4_4_;
    local_88._8_4_ = local_88._4_4_;
    local_88._12_4_ = local_88._4_4_;
    lVar17 = (long)dstride;
    for (lVar19 = 0; lVar19 < block_height; lVar19 = lVar19 + 4) {
      uVar3 = *(undefined8 *)in;
      uVar4 = *(undefined8 *)(in + 0x90);
      uVar5 = *(undefined8 *)(in + 0x120);
      uVar6 = *(undefined8 *)(in + 0x1b0);
      auVar137._8_8_ = uVar5;
      auVar137._0_8_ = uVar6;
      uVar7 = *(undefined8 *)(in + lVar14);
      uVar8 = *(undefined8 *)(in + lVar14 + 0x90);
      uVar9 = *(undefined8 *)(in + lVar14 + 0x120);
      uVar10 = *(undefined8 *)(in + lVar14 + 0x1b0);
      sVar38 = (short)uVar4;
      auVar107._0_2_ = (short)uVar8 - sVar38;
      sVar40 = (short)((ulong)uVar4 >> 0x10);
      auVar107._2_2_ = (short)((ulong)uVar8 >> 0x10) - sVar40;
      sVar42 = (short)((ulong)uVar4 >> 0x20);
      auVar107._4_2_ = (short)((ulong)uVar8 >> 0x20) - sVar42;
      sVar44 = (short)((ulong)uVar4 >> 0x30);
      auVar107._6_2_ = (short)((ulong)uVar8 >> 0x30) - sVar44;
      sVar46 = (short)uVar3;
      auVar107._8_2_ = (short)uVar7 - sVar46;
      sVar48 = (short)((ulong)uVar3 >> 0x10);
      auVar107._10_2_ = (short)((ulong)uVar7 >> 0x10) - sVar48;
      sVar49 = (short)((ulong)uVar3 >> 0x20);
      auVar107._12_2_ = (short)((ulong)uVar7 >> 0x20) - sVar49;
      sVar51 = (short)((ulong)uVar3 >> 0x30);
      auVar107._14_2_ = (short)((ulong)uVar7 >> 0x30) - sVar51;
      sVar50 = (short)uVar6;
      auVar125._0_2_ = (short)uVar10 - sVar50;
      sVar52 = (short)((ulong)uVar6 >> 0x10);
      auVar125._2_2_ = (short)((ulong)uVar10 >> 0x10) - sVar52;
      sVar54 = (short)((ulong)uVar6 >> 0x20);
      auVar125._4_2_ = (short)((ulong)uVar10 >> 0x20) - sVar54;
      sVar56 = (short)((ulong)uVar6 >> 0x30);
      auVar125._6_2_ = (short)((ulong)uVar10 >> 0x30) - sVar56;
      sVar58 = (short)uVar5;
      auVar125._8_2_ = (short)uVar9 - sVar58;
      sVar60 = (short)((ulong)uVar5 >> 0x10);
      auVar125._10_2_ = (short)((ulong)uVar9 >> 0x10) - sVar60;
      sVar62 = (short)((ulong)uVar5 >> 0x20);
      auVar125._12_2_ = (short)((ulong)uVar9 >> 0x20) - sVar62;
      sVar64 = (short)((ulong)uVar5 >> 0x30);
      auVar125._14_2_ = (short)((ulong)uVar9 >> 0x30) - sVar64;
      auVar66 = pabsw(in_XMM10,auVar107);
      auVar153 = psraw(auVar107,0xf);
      auVar79 = pabsw(in_XMM11,auVar125);
      auVar105 = psraw(auVar125,0xf);
      uVar89 = (ulong)uVar16;
      uVar21 = auVar66._0_2_;
      auVar110._0_2_ = uVar21 >> uVar89;
      uVar35 = auVar66._2_2_;
      auVar110._2_2_ = uVar35 >> uVar89;
      uVar37 = auVar66._4_2_;
      auVar110._4_2_ = uVar37 >> uVar89;
      uVar39 = auVar66._6_2_;
      auVar110._6_2_ = uVar39 >> uVar89;
      uVar41 = auVar66._8_2_;
      auVar110._8_2_ = uVar41 >> uVar89;
      uVar43 = auVar66._10_2_;
      auVar110._10_2_ = uVar43 >> uVar89;
      uVar45 = auVar66._12_2_;
      uVar47 = auVar66._14_2_;
      auVar110._12_2_ = uVar45 >> uVar89;
      auVar110._14_2_ = uVar47 >> uVar89;
      uVar88 = auVar79._0_2_;
      auVar160._0_2_ = uVar88 >> uVar89;
      uVar93 = auVar79._2_2_;
      auVar160._2_2_ = uVar93 >> uVar89;
      uVar95 = auVar79._4_2_;
      auVar160._4_2_ = uVar95 >> uVar89;
      uVar97 = auVar79._6_2_;
      auVar160._6_2_ = uVar97 >> uVar89;
      uVar99 = auVar79._8_2_;
      auVar160._8_2_ = uVar99 >> uVar89;
      uVar101 = auVar79._10_2_;
      auVar160._10_2_ = uVar101 >> uVar89;
      uVar103 = auVar79._12_2_;
      uVar104 = auVar79._14_2_;
      auVar160._12_2_ = uVar103 >> uVar89;
      auVar160._14_2_ = uVar104 >> uVar89;
      auVar79 = psubusw(auVar25,auVar110);
      auVar66 = psubusw(auVar25,auVar160);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar66._0_2_;
      sVar36 = auVar66._2_2_;
      sVar53 = auVar66._4_2_;
      sVar55 = auVar66._6_2_;
      sVar57 = auVar66._8_2_;
      sVar59 = auVar66._10_2_;
      sVar61 = auVar66._12_2_;
      sVar63 = auVar66._14_2_;
      auVar118._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar118._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar118._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar118._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar118._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar118._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar118._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar118._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar111._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar105._0_2_;
      auVar111._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar105._2_2_;
      auVar111._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar105._4_2_;
      auVar111._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar105._6_2_;
      auVar111._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar105._8_2_;
      auVar111._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar105._10_2_;
      auVar111._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar105._12_2_;
      auVar111._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar105._14_2_;
      auVar118 = auVar118 ^ auVar153;
      auVar111 = auVar111 ^ auVar105;
      uVar3 = *(undefined8 *)(in + -lVar14);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar14));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar14));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar14));
      auVar115._0_2_ = (short)uVar4 - sVar38;
      auVar115._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar115._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar115._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar115._8_2_ = (short)uVar3 - sVar46;
      auVar115._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar115._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar115._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar145._0_2_ = (short)uVar6 - sVar50;
      auVar145._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar52;
      auVar145._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar54;
      auVar145._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar56;
      auVar145._8_2_ = (short)uVar5 - sVar58;
      auVar145._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar60;
      auVar145._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar62;
      auVar145._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar64;
      auVar66 = pabsw(auVar160,auVar115);
      auVar153 = psraw(auVar115,0xf);
      auVar107 = pabsw(in_XMM13,auVar145);
      auVar105 = psraw(auVar145,0xf);
      uVar90 = (ulong)uVar16;
      uVar21 = auVar66._0_2_;
      auVar126._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar66._2_2_;
      auVar126._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar66._4_2_;
      auVar126._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar66._6_2_;
      auVar126._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar66._8_2_;
      auVar126._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar66._10_2_;
      auVar126._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar66._12_2_;
      uVar47 = auVar66._14_2_;
      auVar126._12_2_ = uVar45 >> uVar90;
      auVar126._14_2_ = uVar47 >> uVar90;
      uVar88 = auVar107._0_2_;
      auVar181._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar107._2_2_;
      auVar181._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar107._4_2_;
      auVar181._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar107._6_2_;
      auVar181._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar107._8_2_;
      auVar181._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar107._10_2_;
      auVar181._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar107._12_2_;
      uVar104 = auVar107._14_2_;
      auVar181._12_2_ = uVar103 >> uVar90;
      auVar181._14_2_ = uVar104 >> uVar90;
      auVar79 = psubusw(auVar25,auVar126);
      auVar66 = psubusw(auVar25,auVar181);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar66._0_2_;
      sVar36 = auVar66._2_2_;
      sVar53 = auVar66._4_2_;
      sVar55 = auVar66._6_2_;
      sVar57 = auVar66._8_2_;
      sVar59 = auVar66._10_2_;
      sVar61 = auVar66._12_2_;
      sVar63 = auVar66._14_2_;
      auVar134._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar134._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar134._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar134._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar134._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar134._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar134._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar134._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar127._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar105._0_2_;
      auVar127._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar105._2_2_;
      auVar127._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar105._4_2_;
      auVar127._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar105._6_2_;
      auVar127._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar105._8_2_;
      auVar127._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar105._10_2_;
      auVar127._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar105._12_2_;
      auVar127._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar105._14_2_;
      auVar134 = auVar134 ^ auVar153;
      auVar127 = auVar127 ^ auVar105;
      uVar3 = *(undefined8 *)(in + lVar18);
      uVar4 = *(undefined8 *)(in + lVar18 + 0x90);
      uVar89 = *(ulong *)(in + lVar18 + 0x120);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uVar89;
      uVar5 = *(undefined8 *)(in + lVar18 + 0x1b0);
      auVar131._0_2_ = (short)uVar4 - sVar38;
      auVar131._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar131._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar131._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar131._8_2_ = (short)uVar3 - sVar46;
      auVar131._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar131._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar131._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar112._0_2_ = (short)uVar5 - sVar50;
      auVar112._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
      auVar112._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
      auVar112._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
      auVar112._8_2_ = (short)uVar89 - sVar58;
      auVar112._10_2_ = (short)(uVar89 >> 0x10) - sVar60;
      auVar112._12_2_ = (short)(uVar89 >> 0x20) - sVar62;
      auVar112._14_2_ = (short)(uVar89 >> 0x30) - sVar64;
      auVar66 = pabsw(auVar119,auVar131);
      auVar153 = psraw(auVar131,0xf);
      uVar21 = auVar66._0_2_;
      auVar146._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar66._2_2_;
      auVar146._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar66._4_2_;
      auVar146._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar66._6_2_;
      auVar146._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar66._8_2_;
      auVar146._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar66._10_2_;
      auVar146._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar66._12_2_;
      uVar47 = auVar66._14_2_;
      auVar146._12_2_ = uVar45 >> uVar90;
      auVar146._14_2_ = uVar47 >> uVar90;
      auVar66 = pabsw(auVar107,auVar112);
      uVar88 = auVar66._0_2_;
      auVar182._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar66._2_2_;
      auVar182._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar66._4_2_;
      auVar182._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar66._6_2_;
      auVar182._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar66._8_2_;
      auVar182._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar66._10_2_;
      auVar182._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar66._12_2_;
      uVar104 = auVar66._14_2_;
      auVar182._12_2_ = uVar103 >> uVar90;
      auVar182._14_2_ = uVar104 >> uVar90;
      auVar66 = psraw(auVar112,0xf);
      auVar105 = psubusw(auVar25,auVar146);
      auVar79 = psubusw(auVar25,auVar182);
      sVar65 = auVar105._0_2_;
      sVar72 = auVar105._2_2_;
      sVar73 = auVar105._4_2_;
      sVar74 = auVar105._6_2_;
      sVar75 = auVar105._8_2_;
      sVar76 = auVar105._10_2_;
      sVar77 = auVar105._12_2_;
      sVar78 = auVar105._14_2_;
      sVar22 = auVar79._0_2_;
      sVar36 = auVar79._2_2_;
      sVar53 = auVar79._4_2_;
      sVar55 = auVar79._6_2_;
      sVar57 = auVar79._8_2_;
      sVar59 = auVar79._10_2_;
      sVar61 = auVar79._12_2_;
      sVar63 = auVar79._14_2_;
      auVar161._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar161._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar161._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar161._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar161._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar161._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar161._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar161._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar147._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar66._0_2_;
      auVar147._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar66._2_2_;
      auVar147._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar66._4_2_;
      auVar147._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar66._6_2_;
      auVar147._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar66._8_2_;
      auVar147._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar66._10_2_;
      auVar147._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar66._12_2_;
      auVar147._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar66._14_2_;
      auVar161 = auVar161 ^ auVar153;
      auVar147 = auVar147 ^ auVar66;
      uVar3 = *(undefined8 *)(in + -lVar18);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar18));
      uVar5 = *(undefined8 *)(in + (0x120 - lVar18));
      uVar6 = *(undefined8 *)(in + (0x1b0 - lVar18));
      auVar139._0_2_ = (short)uVar4 - sVar38;
      auVar139._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar139._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar139._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar139._8_2_ = (short)uVar3 - sVar46;
      auVar139._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar139._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar139._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar172._0_2_ = (short)uVar6 - sVar50;
      auVar172._2_2_ = (short)((ulong)uVar6 >> 0x10) - sVar52;
      auVar172._4_2_ = (short)((ulong)uVar6 >> 0x20) - sVar54;
      auVar172._6_2_ = (short)((ulong)uVar6 >> 0x30) - sVar56;
      auVar172._8_2_ = (short)uVar5 - sVar58;
      auVar172._10_2_ = (short)((ulong)uVar5 >> 0x10) - sVar60;
      auVar172._12_2_ = (short)((ulong)uVar5 >> 0x20) - sVar62;
      auVar172._14_2_ = (short)((ulong)uVar5 >> 0x30) - sVar64;
      auVar66 = pabsw(auVar182,auVar139);
      auVar153 = psraw(auVar139,0xf);
      uVar90 = (ulong)uVar16;
      uVar21 = auVar66._0_2_;
      auVar113._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar66._2_2_;
      auVar113._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar66._4_2_;
      auVar113._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar66._6_2_;
      auVar113._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar66._8_2_;
      auVar113._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar66._10_2_;
      auVar113._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar66._12_2_;
      uVar47 = auVar66._14_2_;
      auVar113._12_2_ = uVar45 >> uVar90;
      auVar113._14_2_ = uVar47 >> uVar90;
      auVar26 = pabsw(auVar26,auVar172);
      uVar88 = auVar26._0_2_;
      auVar189._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar26._2_2_;
      auVar189._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar26._4_2_;
      auVar189._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar26._6_2_;
      auVar189._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar26._8_2_;
      auVar189._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar26._10_2_;
      auVar189._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar26._12_2_;
      uVar104 = auVar26._14_2_;
      auVar189._12_2_ = uVar103 >> uVar90;
      auVar189._14_2_ = uVar104 >> uVar90;
      auVar79 = psraw(auVar172,0xf);
      auVar66 = psubusw(auVar25,auVar113);
      auVar26 = psubusw(auVar25,auVar189);
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      sVar22 = auVar26._0_2_;
      sVar36 = auVar26._2_2_;
      sVar53 = auVar26._4_2_;
      sVar55 = auVar26._6_2_;
      sVar57 = auVar26._8_2_;
      sVar59 = auVar26._10_2_;
      sVar61 = auVar26._12_2_;
      sVar63 = auVar26._14_2_;
      auVar120._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar120._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar120._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar120._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar120._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar120._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar120._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar120._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar114._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar79._0_2_;
      auVar114._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar79._2_2_;
      auVar114._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar79._4_2_;
      auVar114._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar79._6_2_;
      auVar114._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar79._8_2_;
      auVar114._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar79._10_2_;
      auVar114._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar79._12_2_;
      auVar114._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar79._14_2_;
      auVar120 = auVar120 ^ auVar153;
      auVar114 = auVar114 ^ auVar79;
      uVar3 = *(undefined8 *)(in + lVar15);
      uVar4 = *(undefined8 *)(in + lVar15 + 0x90);
      uVar89 = *(ulong *)(in + lVar15 + 0x120);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar89;
      uVar5 = *(undefined8 *)(in + lVar15 + 0x1b0);
      auVar155._0_2_ = (short)uVar4 - sVar38;
      auVar155._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar155._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar155._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar155._8_2_ = (short)uVar3 - sVar46;
      auVar155._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar155._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar155._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar128._0_2_ = (short)uVar5 - sVar50;
      auVar128._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
      auVar128._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
      auVar128._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
      auVar128._8_2_ = (short)uVar89 - sVar58;
      auVar128._10_2_ = (short)(uVar89 >> 0x10) - sVar60;
      auVar128._12_2_ = (short)(uVar89 >> 0x20) - sVar62;
      auVar128._14_2_ = (short)(uVar89 >> 0x30) - sVar64;
      auVar26 = pabsw(auVar26,auVar155);
      auVar153 = psraw(auVar155,0xf);
      uVar21 = auVar26._0_2_;
      auVar135._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar26._2_2_;
      auVar135._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar26._4_2_;
      auVar135._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar26._6_2_;
      auVar135._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar26._8_2_;
      auVar135._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar26._10_2_;
      auVar135._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar26._12_2_;
      uVar47 = auVar26._14_2_;
      auVar135._12_2_ = uVar45 >> uVar90;
      auVar135._14_2_ = uVar47 >> uVar90;
      auVar26 = pabsw(auVar79,auVar128);
      uVar88 = auVar26._0_2_;
      auVar183._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar26._2_2_;
      auVar183._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar26._4_2_;
      auVar183._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar26._6_2_;
      auVar183._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar26._8_2_;
      auVar183._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar26._10_2_;
      auVar183._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar26._12_2_;
      uVar104 = auVar26._14_2_;
      auVar183._12_2_ = uVar103 >> uVar90;
      auVar183._14_2_ = uVar104 >> uVar90;
      auVar26 = psraw(auVar128,0xf);
      auVar79 = psubusw(auVar25,auVar135);
      auVar66 = psubusw(auVar25,auVar183);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar66._0_2_;
      sVar36 = auVar66._2_2_;
      sVar53 = auVar66._4_2_;
      sVar55 = auVar66._6_2_;
      sVar57 = auVar66._8_2_;
      sVar59 = auVar66._10_2_;
      sVar61 = auVar66._12_2_;
      sVar63 = auVar66._14_2_;
      auVar162._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar162._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar162._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar162._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar162._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar162._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar162._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar162._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar148._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar26._0_2_;
      auVar148._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar26._2_2_;
      auVar148._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar26._4_2_;
      auVar148._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar26._6_2_;
      auVar148._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar26._8_2_;
      auVar148._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar26._10_2_;
      auVar148._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar26._12_2_;
      auVar148._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar26._14_2_;
      auVar162 = auVar162 ^ auVar153;
      auVar148 = auVar148 ^ auVar26;
      uVar3 = *(undefined8 *)(in + -lVar15);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar15));
      uVar89 = *(ulong *)(in + (0x120 - lVar15));
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar89;
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar15));
      auVar167._0_2_ = (short)uVar4 - sVar38;
      auVar167._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar167._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar167._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar167._8_2_ = (short)uVar3 - sVar46;
      auVar167._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar167._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar167._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar173._0_2_ = (short)uVar5 - sVar50;
      auVar173._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
      auVar173._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
      auVar173._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
      auVar173._8_2_ = (short)uVar89 - sVar58;
      auVar173._10_2_ = (short)(uVar89 >> 0x10) - sVar60;
      auVar173._12_2_ = (short)(uVar89 >> 0x20) - sVar62;
      auVar173._14_2_ = (short)(uVar89 >> 0x30) - sVar64;
      auVar26 = pabsw(auVar153,auVar167);
      auVar153 = psraw(auVar167,0xf);
      uVar21 = auVar26._0_2_;
      auVar129._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar26._2_2_;
      auVar129._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar26._4_2_;
      auVar129._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar26._6_2_;
      auVar129._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar26._8_2_;
      auVar129._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar26._10_2_;
      auVar129._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar26._12_2_;
      uVar47 = auVar26._14_2_;
      auVar129._12_2_ = uVar45 >> uVar90;
      auVar129._14_2_ = uVar47 >> uVar90;
      auVar26 = pabsw(auVar183,auVar173);
      uVar88 = auVar26._0_2_;
      auVar190._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar26._2_2_;
      auVar190._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar26._4_2_;
      auVar190._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar26._6_2_;
      auVar190._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar26._8_2_;
      auVar190._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar26._10_2_;
      auVar190._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar26._12_2_;
      uVar104 = auVar26._14_2_;
      auVar190._12_2_ = uVar103 >> uVar90;
      auVar190._14_2_ = uVar104 >> uVar90;
      auVar79 = psraw(auVar173,0xf);
      auVar66 = psubusw(auVar25,auVar129);
      auVar26 = psubusw(auVar25,auVar190);
      sVar65 = auVar66._0_2_;
      sVar72 = auVar66._2_2_;
      sVar73 = auVar66._4_2_;
      sVar74 = auVar66._6_2_;
      sVar75 = auVar66._8_2_;
      sVar76 = auVar66._10_2_;
      sVar77 = auVar66._12_2_;
      sVar78 = auVar66._14_2_;
      sVar22 = auVar26._0_2_;
      sVar36 = auVar26._2_2_;
      sVar53 = auVar26._4_2_;
      sVar55 = auVar26._6_2_;
      sVar57 = auVar26._8_2_;
      sVar59 = auVar26._10_2_;
      sVar61 = auVar26._12_2_;
      sVar63 = auVar26._14_2_;
      auVar136._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar136._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar136._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar136._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar136._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar136._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar136._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar136._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar130._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar79._0_2_;
      auVar130._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar79._2_2_;
      auVar130._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar79._4_2_;
      auVar130._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar79._6_2_;
      auVar130._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar79._8_2_;
      auVar130._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar79._10_2_;
      auVar130._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar79._12_2_;
      auVar130._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar79._14_2_;
      auVar136 = auVar136 ^ auVar153;
      in_XMM10._0_2_ = auVar136._0_2_ + auVar162._0_2_;
      in_XMM10._2_2_ = auVar136._2_2_ + auVar162._2_2_;
      in_XMM10._4_2_ = auVar136._4_2_ + auVar162._4_2_;
      in_XMM10._6_2_ = auVar136._6_2_ + auVar162._6_2_;
      in_XMM10._8_2_ = auVar136._8_2_ + auVar162._8_2_;
      in_XMM10._10_2_ = auVar136._10_2_ + auVar162._10_2_;
      in_XMM10._12_2_ = auVar136._12_2_ + auVar162._12_2_;
      in_XMM10._14_2_ = auVar136._14_2_ + auVar162._14_2_;
      auVar130 = auVar130 ^ auVar79;
      uVar3 = *(undefined8 *)(in + lVar20);
      uVar4 = *(undefined8 *)(in + lVar20 + 0x90);
      uVar89 = *(ulong *)(in + lVar20 + 0x120);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar89;
      uVar5 = *(undefined8 *)(in + lVar20 + 0x1b0);
      auVar176._0_2_ = (short)uVar4 - sVar38;
      auVar176._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar176._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar176._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar176._8_2_ = (short)uVar3 - sVar46;
      auVar176._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar176._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar176._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar149._0_2_ = (short)uVar5 - sVar50;
      auVar149._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
      auVar149._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
      auVar149._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
      auVar149._8_2_ = (short)uVar89 - sVar58;
      auVar149._10_2_ = (short)(uVar89 >> 0x10) - sVar60;
      auVar149._12_2_ = (short)(uVar89 >> 0x20) - sVar62;
      auVar149._14_2_ = (short)(uVar89 >> 0x30) - sVar64;
      auVar26 = pabsw(auVar66,auVar176);
      auVar153 = psraw(auVar176,0xf);
      auVar79 = pabsw(auVar162,auVar149);
      auVar66 = psraw(auVar149,0xf);
      uVar21 = auVar26._0_2_;
      auVar174._0_2_ = uVar21 >> uVar90;
      uVar35 = auVar26._2_2_;
      auVar174._2_2_ = uVar35 >> uVar90;
      uVar37 = auVar26._4_2_;
      auVar174._4_2_ = uVar37 >> uVar90;
      uVar39 = auVar26._6_2_;
      auVar174._6_2_ = uVar39 >> uVar90;
      uVar41 = auVar26._8_2_;
      auVar174._8_2_ = uVar41 >> uVar90;
      uVar43 = auVar26._10_2_;
      auVar174._10_2_ = uVar43 >> uVar90;
      uVar45 = auVar26._12_2_;
      uVar47 = auVar26._14_2_;
      auVar174._12_2_ = uVar45 >> uVar90;
      auVar174._14_2_ = uVar47 >> uVar90;
      uVar88 = auVar79._0_2_;
      auVar191._0_2_ = uVar88 >> uVar90;
      uVar93 = auVar79._2_2_;
      auVar191._2_2_ = uVar93 >> uVar90;
      uVar95 = auVar79._4_2_;
      auVar191._4_2_ = uVar95 >> uVar90;
      uVar97 = auVar79._6_2_;
      auVar191._6_2_ = uVar97 >> uVar90;
      uVar99 = auVar79._8_2_;
      auVar191._8_2_ = uVar99 >> uVar90;
      uVar101 = auVar79._10_2_;
      auVar191._10_2_ = uVar101 >> uVar90;
      uVar103 = auVar79._12_2_;
      uVar104 = auVar79._14_2_;
      auVar191._12_2_ = uVar103 >> uVar90;
      auVar191._14_2_ = uVar104 >> uVar90;
      auVar79 = psubusw(auVar25,auVar174);
      auVar26 = psubusw(auVar25,auVar191);
      sVar65 = auVar79._0_2_;
      sVar72 = auVar79._2_2_;
      sVar73 = auVar79._4_2_;
      sVar74 = auVar79._6_2_;
      sVar75 = auVar79._8_2_;
      sVar76 = auVar79._10_2_;
      sVar77 = auVar79._12_2_;
      sVar78 = auVar79._14_2_;
      sVar22 = auVar26._0_2_;
      sVar36 = auVar26._2_2_;
      sVar53 = auVar26._4_2_;
      sVar55 = auVar26._6_2_;
      sVar57 = auVar26._8_2_;
      sVar59 = auVar26._10_2_;
      sVar61 = auVar26._12_2_;
      sVar63 = auVar26._14_2_;
      auVar184._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar153._0_2_;
      auVar184._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar153._2_2_;
      auVar184._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar153._4_2_;
      auVar184._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar153._6_2_;
      auVar184._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar153._8_2_;
      auVar184._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar153._10_2_;
      auVar184._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar153._12_2_;
      auVar184._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar153._14_2_;
      auVar175._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar66._0_2_;
      auVar175._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar66._2_2_;
      auVar175._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar66._4_2_;
      auVar175._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar66._6_2_;
      auVar175._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar66._8_2_;
      auVar175._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar66._10_2_;
      auVar175._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar66._12_2_;
      auVar175._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar66._14_2_;
      auVar184 = auVar184 ^ auVar153;
      uVar3 = *(undefined8 *)(in + -lVar20);
      uVar4 = *(undefined8 *)(in + (0x90 - lVar20));
      uVar89 = *(ulong *)(in + (0x120 - lVar20));
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar89;
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar20));
      auVar86._0_2_ = (short)uVar4 - sVar38;
      auVar86._2_2_ = (short)((ulong)uVar4 >> 0x10) - sVar40;
      auVar86._4_2_ = (short)((ulong)uVar4 >> 0x20) - sVar42;
      auVar86._6_2_ = (short)((ulong)uVar4 >> 0x30) - sVar44;
      auVar86._8_2_ = (short)uVar3 - sVar46;
      auVar86._10_2_ = (short)((ulong)uVar3 >> 0x10) - sVar48;
      auVar86._12_2_ = (short)((ulong)uVar3 >> 0x20) - sVar49;
      auVar86._14_2_ = (short)((ulong)uVar3 >> 0x30) - sVar51;
      auVar192._0_2_ = (short)uVar5 - sVar50;
      auVar192._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar52;
      auVar192._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar54;
      auVar192._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar56;
      auVar192._8_2_ = (short)uVar89 - sVar58;
      auVar192._10_2_ = (short)(uVar89 >> 0x10) - sVar60;
      auVar192._12_2_ = (short)(uVar89 >> 0x20) - sVar62;
      auVar192._14_2_ = (short)(uVar89 >> 0x30) - sVar64;
      auVar26 = pabsw(auVar79,auVar86);
      uVar89 = (ulong)uVar16;
      uVar88 = auVar26._0_2_;
      auVar163._0_2_ = uVar88 >> uVar89;
      uVar93 = auVar26._2_2_;
      auVar163._2_2_ = uVar93 >> uVar89;
      uVar95 = auVar26._4_2_;
      auVar163._4_2_ = uVar95 >> uVar89;
      uVar97 = auVar26._6_2_;
      auVar163._6_2_ = uVar97 >> uVar89;
      uVar99 = auVar26._8_2_;
      auVar163._8_2_ = uVar99 >> uVar89;
      uVar101 = auVar26._10_2_;
      auVar163._10_2_ = uVar101 >> uVar89;
      uVar103 = auVar26._12_2_;
      uVar104 = auVar26._14_2_;
      auVar163._12_2_ = uVar103 >> uVar89;
      auVar163._14_2_ = uVar104 >> uVar89;
      auVar26 = pabsw(auVar137,auVar192);
      uVar21 = auVar26._0_2_;
      auVar105._0_2_ = uVar21 >> uVar89;
      uVar35 = auVar26._2_2_;
      auVar105._2_2_ = uVar35 >> uVar89;
      uVar37 = auVar26._4_2_;
      auVar105._4_2_ = uVar37 >> uVar89;
      uVar39 = auVar26._6_2_;
      auVar105._6_2_ = uVar39 >> uVar89;
      uVar41 = auVar26._8_2_;
      auVar105._8_2_ = uVar41 >> uVar89;
      uVar43 = auVar26._10_2_;
      auVar105._10_2_ = uVar43 >> uVar89;
      uVar45 = auVar26._12_2_;
      uVar47 = auVar26._14_2_;
      auVar105._12_2_ = uVar45 >> uVar89;
      auVar105._14_2_ = uVar47 >> uVar89;
      in_XMM13 = auVar175 ^ auVar66;
      auVar26 = psubusw(auVar25,auVar163);
      auVar137 = psubusw(auVar25,auVar105);
      sVar22 = auVar26._0_2_;
      sVar36 = auVar26._2_2_;
      sVar53 = auVar26._4_2_;
      sVar55 = auVar26._6_2_;
      sVar57 = auVar26._8_2_;
      sVar59 = auVar26._10_2_;
      sVar61 = auVar26._12_2_;
      sVar63 = auVar26._14_2_;
      sVar65 = auVar137._0_2_;
      sVar72 = auVar137._2_2_;
      sVar73 = auVar137._4_2_;
      sVar74 = auVar137._6_2_;
      sVar75 = auVar137._8_2_;
      sVar76 = auVar137._10_2_;
      sVar77 = auVar137._12_2_;
      sVar78 = auVar137._14_2_;
      auVar26 = psraw(auVar86,0xf);
      auVar150._0_2_ =
           (((short)uVar88 < sVar22) * uVar88 | (ushort)((short)uVar88 >= sVar22) * sVar22) +
           auVar26._0_2_;
      auVar150._2_2_ =
           (((short)uVar93 < sVar36) * uVar93 | (ushort)((short)uVar93 >= sVar36) * sVar36) +
           auVar26._2_2_;
      auVar150._4_2_ =
           (((short)uVar95 < sVar53) * uVar95 | (ushort)((short)uVar95 >= sVar53) * sVar53) +
           auVar26._4_2_;
      auVar150._6_2_ =
           (((short)uVar97 < sVar55) * uVar97 | (ushort)((short)uVar97 >= sVar55) * sVar55) +
           auVar26._6_2_;
      auVar150._8_2_ =
           (((short)uVar99 < sVar57) * uVar99 | (ushort)((short)uVar99 >= sVar57) * sVar57) +
           auVar26._8_2_;
      auVar150._10_2_ =
           (((short)uVar101 < sVar59) * uVar101 | (ushort)((short)uVar101 >= sVar59) * sVar59) +
           auVar26._10_2_;
      auVar150._12_2_ =
           (((short)uVar103 < sVar61) * uVar103 | (ushort)((short)uVar103 >= sVar61) * sVar61) +
           auVar26._12_2_;
      auVar150._14_2_ =
           (((short)uVar104 < sVar63) * uVar104 | (ushort)((short)uVar104 >= sVar63) * sVar63) +
           auVar26._14_2_;
      auVar150 = auVar150 ^ auVar26;
      auVar26 = psraw(auVar192,0xf);
      auVar164._0_2_ =
           (((short)uVar21 < sVar65) * uVar21 | (ushort)((short)uVar21 >= sVar65) * sVar65) +
           auVar26._0_2_;
      auVar164._2_2_ =
           (((short)uVar35 < sVar72) * uVar35 | (ushort)((short)uVar35 >= sVar72) * sVar72) +
           auVar26._2_2_;
      auVar164._4_2_ =
           (((short)uVar37 < sVar73) * uVar37 | (ushort)((short)uVar37 >= sVar73) * sVar73) +
           auVar26._4_2_;
      auVar164._6_2_ =
           (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
           auVar26._6_2_;
      auVar164._8_2_ =
           (((short)uVar41 < sVar75) * uVar41 | (ushort)((short)uVar41 >= sVar75) * sVar75) +
           auVar26._8_2_;
      auVar164._10_2_ =
           (((short)uVar43 < sVar76) * uVar43 | (ushort)((short)uVar43 >= sVar76) * sVar76) +
           auVar26._10_2_;
      auVar164._12_2_ =
           (((short)uVar45 < sVar77) * uVar45 | (ushort)((short)uVar45 >= sVar77) * sVar77) +
           auVar26._12_2_;
      auVar164._14_2_ =
           (((short)uVar47 < sVar78) * uVar47 | (ushort)((short)uVar47 >= sVar78) * sVar78) +
           auVar26._14_2_;
      auVar164 = auVar164 ^ auVar26;
      sVar22 = auVar121._0_2_;
      sVar36 = auVar121._2_2_;
      auVar151._0_2_ =
           (auVar150._0_2_ + auVar184._0_2_ + in_XMM10._0_2_) * sVar22 +
           (auVar120._0_2_ + auVar161._0_2_ + auVar134._0_2_ + auVar118._0_2_) * local_98;
      auVar151._2_2_ =
           (auVar150._2_2_ + auVar184._2_2_ + in_XMM10._2_2_) * sVar36 +
           (auVar120._2_2_ + auVar161._2_2_ + auVar134._2_2_ + auVar118._2_2_) * sStack_96;
      auVar151._4_2_ =
           (auVar150._4_2_ + auVar184._4_2_ + in_XMM10._4_2_) * sVar22 +
           (auVar120._4_2_ + auVar161._4_2_ + auVar134._4_2_ + auVar118._4_2_) * local_98;
      auVar151._6_2_ =
           (auVar150._6_2_ + auVar184._6_2_ + in_XMM10._6_2_) * sVar36 +
           (auVar120._6_2_ + auVar161._6_2_ + auVar134._6_2_ + auVar118._6_2_) * sStack_96;
      auVar151._8_2_ =
           (auVar150._8_2_ + auVar184._8_2_ + in_XMM10._8_2_) * sVar22 +
           (auVar120._8_2_ + auVar161._8_2_ + auVar134._8_2_ + auVar118._8_2_) * local_98;
      auVar151._10_2_ =
           (auVar150._10_2_ + auVar184._10_2_ + in_XMM10._10_2_) * sVar36 +
           (auVar120._10_2_ + auVar161._10_2_ + auVar134._10_2_ + auVar118._10_2_) * sStack_96;
      auVar151._12_2_ =
           (auVar150._12_2_ + auVar184._12_2_ + in_XMM10._12_2_) * sVar22 +
           (auVar120._12_2_ + auVar161._12_2_ + auVar134._12_2_ + auVar118._12_2_) * local_98;
      auVar151._14_2_ =
           (auVar150._14_2_ + auVar184._14_2_ + in_XMM10._14_2_) * sVar36 +
           (auVar120._14_2_ + auVar161._14_2_ + auVar134._14_2_ + auVar118._14_2_) * sStack_96;
      auVar165._0_2_ =
           (auVar164._0_2_ + in_XMM13._0_2_ + auVar130._0_2_ + auVar148._0_2_) * sVar22 +
           (auVar114._0_2_ + auVar147._0_2_ + auVar127._0_2_ + auVar111._0_2_) * local_98;
      auVar165._2_2_ =
           (auVar164._2_2_ + in_XMM13._2_2_ + auVar130._2_2_ + auVar148._2_2_) * sVar36 +
           (auVar114._2_2_ + auVar147._2_2_ + auVar127._2_2_ + auVar111._2_2_) * sStack_96;
      auVar165._4_2_ =
           (auVar164._4_2_ + in_XMM13._4_2_ + auVar130._4_2_ + auVar148._4_2_) * sVar22 +
           (auVar114._4_2_ + auVar147._4_2_ + auVar127._4_2_ + auVar111._4_2_) * local_98;
      auVar165._6_2_ =
           (auVar164._6_2_ + in_XMM13._6_2_ + auVar130._6_2_ + auVar148._6_2_) * sVar36 +
           (auVar114._6_2_ + auVar147._6_2_ + auVar127._6_2_ + auVar111._6_2_) * sStack_96;
      auVar165._8_2_ =
           (auVar164._8_2_ + in_XMM13._8_2_ + auVar130._8_2_ + auVar148._8_2_) * sVar22 +
           (auVar114._8_2_ + auVar147._8_2_ + auVar127._8_2_ + auVar111._8_2_) * local_98;
      auVar165._10_2_ =
           (auVar164._10_2_ + in_XMM13._10_2_ + auVar130._10_2_ + auVar148._10_2_) * sVar36 +
           (auVar114._10_2_ + auVar147._10_2_ + auVar127._10_2_ + auVar111._10_2_) * sStack_96;
      auVar165._12_2_ =
           (auVar164._12_2_ + in_XMM13._12_2_ + auVar130._12_2_ + auVar148._12_2_) * sVar22 +
           (auVar114._12_2_ + auVar147._12_2_ + auVar127._12_2_ + auVar111._12_2_) * local_98;
      auVar165._14_2_ =
           (auVar164._14_2_ + in_XMM13._14_2_ + auVar130._14_2_ + auVar148._14_2_) * sVar36 +
           (auVar114._14_2_ + auVar147._14_2_ + auVar127._14_2_ + auVar111._14_2_) * sStack_96;
      auVar137 = psraw(auVar151,0xf);
      auVar26 = pmovsxbw(local_88,0x808080808080808);
      auVar152._0_2_ = auVar151._0_2_ + auVar26._0_2_ + auVar137._0_2_;
      auVar152._2_2_ = auVar151._2_2_ + auVar26._2_2_ + auVar137._2_2_;
      auVar152._4_2_ = auVar151._4_2_ + auVar26._4_2_ + auVar137._4_2_;
      auVar152._6_2_ = auVar151._6_2_ + auVar26._6_2_ + auVar137._6_2_;
      auVar152._8_2_ = auVar151._8_2_ + auVar26._8_2_ + auVar137._8_2_;
      auVar152._10_2_ = auVar151._10_2_ + auVar26._10_2_ + auVar137._10_2_;
      auVar152._12_2_ = auVar151._12_2_ + auVar26._12_2_ + auVar137._12_2_;
      auVar152._14_2_ = auVar151._14_2_ + auVar26._14_2_ + auVar137._14_2_;
      auVar137 = psraw(auVar152,4);
      in_XMM11._0_8_ =
           CONCAT26(auVar137._6_2_ + sVar44,
                    CONCAT24(auVar137._4_2_ + sVar42,
                             CONCAT22(auVar137._2_2_ + sVar40,auVar137._0_2_ + sVar38)));
      in_XMM11._8_2_ = auVar137._8_2_ + sVar46;
      in_XMM11._10_2_ = auVar137._10_2_ + sVar48;
      in_XMM11._12_2_ = auVar137._12_2_ + sVar49;
      in_XMM11._14_2_ = auVar137._14_2_ + sVar51;
      auVar137 = psraw(auVar165,0xf);
      *(long *)dest = in_XMM11._8_8_;
      auVar166._0_2_ = auVar165._0_2_ + auVar26._0_2_ + auVar137._0_2_;
      auVar166._2_2_ = auVar165._2_2_ + auVar26._2_2_ + auVar137._2_2_;
      auVar166._4_2_ = auVar165._4_2_ + auVar26._4_2_ + auVar137._4_2_;
      auVar166._6_2_ = auVar165._6_2_ + auVar26._6_2_ + auVar137._6_2_;
      auVar166._8_2_ = auVar165._8_2_ + auVar26._8_2_ + auVar137._8_2_;
      auVar166._10_2_ = auVar165._10_2_ + auVar26._10_2_ + auVar137._10_2_;
      auVar166._12_2_ = auVar165._12_2_ + auVar26._12_2_ + auVar137._12_2_;
      auVar166._14_2_ = auVar165._14_2_ + auVar26._14_2_ + auVar137._14_2_;
      auVar137 = psraw(auVar166,4);
      *(undefined8 *)((long)dest + lVar17 * 2) = in_XMM11._0_8_;
      *(short *)((long)dest + lVar17 * 4 + 8) = auVar137._8_2_ + sVar58;
      *(short *)((long)dest + lVar17 * 4 + 10) = auVar137._10_2_ + sVar60;
      *(short *)((long)dest + lVar17 * 4 + 0xc) = auVar137._12_2_ + sVar62;
      *(short *)((long)dest + lVar17 * 4 + 0xe) = auVar137._14_2_ + sVar64;
      psVar2 = (short *)((long)dest + lVar17 * 6);
      *psVar2 = auVar137._0_2_ + sVar50;
      psVar2[1] = auVar137._2_2_ + sVar52;
      psVar2[2] = auVar137._4_2_ + sVar54;
      psVar2[3] = auVar137._6_2_ + sVar56;
      dest = (void *)((long)dest + lVar17 * 8);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_2)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/0,
                     /*enable_secondary=*/1);
  }
}